

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_head.c
# Opt level: O0

size_t head_header_cb(char *buffer,size_t size,size_t nitems,void *userdata)

{
  char *pcVar1;
  longlong lVar2;
  ufile_file_info *info;
  char *p;
  void *userdata_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  buffer[nitems] = '\0';
  pcVar1 = strstr(buffer,"Content-Type: ");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strstr(buffer,"Content-Length: ");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strstr(buffer,"ETag: ");
      if (pcVar1 != (char *)0x0) {
        pcVar1 = ufile_strconcat(pcVar1 + 6,0);
        *(char **)((long)userdata + 8) = pcVar1;
      }
    }
    else {
      lVar2 = atoll(pcVar1 + 0x10);
      *(longlong *)userdata = lVar2;
    }
  }
  else {
    pcVar1 = ufile_strconcat(pcVar1 + 0xe,0);
    *(char **)((long)userdata + 0x10) = pcVar1;
  }
  return nitems * size;
}

Assistant:

static size_t head_header_cb(char *buffer, size_t size, size_t nitems, void *userdata){
    buffer[nitems] = '\0';
    char *p = NULL;
    struct ufile_file_info *info = (struct ufile_file_info*)userdata;
    if((p = strstr(buffer, CONTENT_TYPE)) != NULL){
        info->mime_type = ufile_strconcat(p+strlen(CONTENT_TYPE), NULL);
    }else if((p = strstr(buffer, CONTENT_LENGTH)) != NULL){
        info->bytes_len = atoll(p+strlen(CONTENT_LENGTH));
    }else if((p = strstr(buffer, ETAG)) != NULL){
        info->etag = ufile_strconcat(p+strlen(ETAG), NULL);
    }
    
    return nitems * size;
}